

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall
cmCTestSVN::LogParser::LogParser(LogParser *this,cmCTestSVN *svn,char *prefix,SVNInfo *svninfo)

{
  SVNInfo *svninfo_local;
  char *prefix_local;
  cmCTestSVN *svn_local;
  LogParser *this_local;
  
  cmProcessTools::OutputLogger::OutputLogger
            (&this->super_OutputLogger,(svn->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_OutputLogger).super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LogParser_00c16740;
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__LogParser_00c16790;
  this->SVN = svn;
  this->SVNRepo = svninfo;
  Revision::Revision(&this->Rev);
  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::vector
            (&this->Changes);
  cmCTestGlobalVC::Change::Change(&this->CurChange,'?');
  std::vector<char,_std::allocator<char>_>::vector(&this->CData);
  (*(this->super_cmXMLParser)._vptr_cmXMLParser[4])(&this->super_cmXMLParser);
  return;
}

Assistant:

LogParser(cmCTestSVN* svn, const char* prefix, SVNInfo& svninfo):
    OutputLogger(svn->Log, prefix), SVN(svn), SVNRepo(svninfo)
  { this->InitializeParser(); }